

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O2

WebPDemuxer * WebPDemuxInternal(WebPData *data,int allow_partial,WebPDemuxState *state,int version)

{
  int *data_00;
  bool bVar1;
  VP8StatusCode VVar2;
  int iVar3;
  ParseStatus PVar4;
  WebPDemuxer *pWVar5;
  Frame *frame;
  ulong data_size;
  ulong uVar6;
  ChunkParser *pCVar7;
  WebPDemuxState WVar8;
  bool bVar9;
  WebPBitstreamFeatures local_58;
  
  if (state != (WebPDemuxState *)0x0) {
    *state = WEBP_DEMUX_PARSE_ERROR;
  }
  if ((data != (WebPData *)0x0 && (version & 0xffffff00U) == 0x100) &&
     (data_00 = (int *)data->bytes, data_00 != (int *)0x0)) {
    data_size = data->size;
    WVar8 = WEBP_DEMUX_PARSING_HEADER;
    if (data_size == 0) {
      return (WebPDemuxer *)0x0;
    }
    if (0x13 < data_size) {
      if (((*data_00 == 0x46464952) && (data_00[2] == 0x50424557)) && (0x10 < data_00[1] + 9U)) {
        uVar6 = (ulong)(uint)data_00[1] + 8;
        bVar9 = data_size < uVar6;
        if (uVar6 < data_size) {
          bVar9 = false;
          data_size = uVar6;
        }
        else if ((allow_partial == 0) && (data_size < uVar6)) {
          return (WebPDemuxer *)0x0;
        }
        pWVar5 = (WebPDemuxer *)WebPSafeCalloc(1,0x68);
        if (pWVar5 == (WebPDemuxer *)0x0) {
          return (WebPDemuxer *)0x0;
        }
        pWVar5->state_ = WEBP_DEMUX_PARSING_HEADER;
        pWVar5->canvas_width_ = -1;
        pWVar5->canvas_height_ = -1;
        pWVar5->loop_count_ = 1;
        pWVar5->bgcolor_ = 0xffffffff;
        pWVar5->frames_tail_ = &pWVar5->frames_;
        pWVar5->chunks_tail_ = &pWVar5->chunks_;
        (pWVar5->mem_).start_ = 0xc;
        (pWVar5->mem_).end_ = data_size;
        (pWVar5->mem_).riff_end_ = uVar6;
        (pWVar5->mem_).buf_size_ = data_size;
        (pWVar5->mem_).buf_ = (uint8_t *)data_00;
        pCVar7 = kMasterChunks;
        do {
          bVar1 = true;
          if (pCVar7->parse == (_func_ParseStatus_WebPDemuxer_ptr *)0x0) {
LAB_001426f8:
            if (state != (WebPDemuxState *)0x0) {
              *state = pWVar5->state_;
            }
            if (bVar1) {
              WebPDemuxDelete(pWVar5);
              return (WebPDemuxer *)0x0;
            }
            return pWVar5;
          }
          if (*(int *)pCVar7->id == data_00[3]) {
            PVar4 = (*pCVar7->parse)(pWVar5);
            if (PVar4 == PARSE_OK) {
              pWVar5->state_ = WEBP_DEMUX_DONE;
            }
            if (((PVar4 == PARSE_ERROR) || (!bVar9 && PVar4 == PARSE_NEED_MORE_DATA)) ||
               (iVar3 = (*pCVar7->valid)(pWVar5), iVar3 == 0)) {
              pWVar5->state_ = WEBP_DEMUX_PARSE_ERROR;
            }
            else {
              bVar1 = false;
            }
            goto LAB_001426f8;
          }
          pCVar7 = pCVar7 + 1;
        } while( true );
      }
      VVar2 = WebPGetFeatures((uint8_t *)data_00,data_size,&local_58);
      if (VVar2 == VP8_STATUS_OK) {
        pWVar5 = (WebPDemuxer *)WebPSafeCalloc(1,0x68);
        frame = (Frame *)WebPSafeCalloc(1,0x50);
        if (frame != (Frame *)0x0 && pWVar5 != (WebPDemuxer *)0x0) {
          pWVar5->state_ = WEBP_DEMUX_PARSING_HEADER;
          pWVar5->canvas_width_ = -1;
          pWVar5->canvas_height_ = -1;
          pWVar5->loop_count_ = 1;
          pWVar5->bgcolor_ = 0xffffffff;
          pWVar5->frames_tail_ = &pWVar5->frames_;
          pWVar5->chunks_tail_ = &pWVar5->chunks_;
          (pWVar5->mem_).start_ = 0;
          (pWVar5->mem_).end_ = data_size;
          (pWVar5->mem_).riff_end_ = 0;
          (pWVar5->mem_).buf_size_ = data_size;
          (pWVar5->mem_).buf_ = (uint8_t *)data_00;
          frame->img_components_[0].offset_ = 0;
          frame->img_components_[0].size_ = data_size;
          frame->width_ = local_58.width;
          frame->height_ = local_58.height;
          frame->has_alpha_ = frame->has_alpha_ | local_58.has_alpha;
          frame->frame_num_ = 1;
          frame->complete_ = 1;
          iVar3 = AddFrame(pWVar5,frame);
          if (iVar3 != 0) {
            pWVar5->state_ = WEBP_DEMUX_DONE;
            iVar3 = frame->height_;
            pWVar5->canvas_width_ = frame->width_;
            pWVar5->canvas_height_ = iVar3;
            pWVar5->feature_flags_ = pWVar5->feature_flags_ | (uint)(frame->has_alpha_ != 0) << 4;
            pWVar5->num_frames_ = 1;
            if (state != (WebPDemuxState *)0x0) {
              *state = WEBP_DEMUX_DONE;
              return pWVar5;
            }
            return pWVar5;
          }
        }
        WebPSafeFree(pWVar5);
        WebPSafeFree(frame);
        WVar8 = WEBP_DEMUX_PARSE_ERROR;
      }
      else {
        WVar8 = -(uint)(VVar2 != VP8_STATUS_NOT_ENOUGH_DATA);
      }
    }
    if (state != (WebPDemuxState *)0x0) {
      *state = WVar8;
    }
  }
  return (WebPDemuxer *)0x0;
}

Assistant:

WebPDemuxer* WebPDemuxInternal(const WebPData* data, int allow_partial,
                               WebPDemuxState* state, int version) {
  const ChunkParser* parser;
  int partial;
  ParseStatus status = PARSE_ERROR;
  MemBuffer mem;
  WebPDemuxer* dmux;

  if (state != NULL) *state = WEBP_DEMUX_PARSE_ERROR;

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_DEMUX_ABI_VERSION)) return NULL;
  if (data == NULL || data->bytes == NULL || data->size == 0) return NULL;

  if (!InitMemBuffer(&mem, data->bytes, data->size)) return NULL;
  status = ReadHeader(&mem);
  if (status != PARSE_OK) {
    // If parsing of the webp file header fails attempt to handle a raw
    // VP8/VP8L frame. Note 'allow_partial' is ignored in this case.
    if (status == PARSE_ERROR) {
      status = CreateRawImageDemuxer(&mem, &dmux);
      if (status == PARSE_OK) {
        if (state != NULL) *state = WEBP_DEMUX_DONE;
        return dmux;
      }
    }
    if (state != NULL) {
      *state = (status == PARSE_NEED_MORE_DATA) ? WEBP_DEMUX_PARSING_HEADER
                                                : WEBP_DEMUX_PARSE_ERROR;
    }
    return NULL;
  }

  partial = (mem.buf_size_ < mem.riff_end_);
  if (!allow_partial && partial) return NULL;

  dmux = (WebPDemuxer*)WebPSafeCalloc(1ULL, sizeof(*dmux));
  if (dmux == NULL) return NULL;
  InitDemux(dmux, &mem);

  status = PARSE_ERROR;
  for (parser = kMasterChunks; parser->parse != NULL; ++parser) {
    if (!memcmp(parser->id, GetBuffer(&dmux->mem_), TAG_SIZE)) {
      status = parser->parse(dmux);
      if (status == PARSE_OK) dmux->state_ = WEBP_DEMUX_DONE;
      if (status == PARSE_NEED_MORE_DATA && !partial) status = PARSE_ERROR;
      if (status != PARSE_ERROR && !parser->valid(dmux)) status = PARSE_ERROR;
      if (status == PARSE_ERROR) dmux->state_ = WEBP_DEMUX_PARSE_ERROR;
      break;
    }
  }
  if (state != NULL) *state = dmux->state_;

  if (status == PARSE_ERROR) {
    WebPDemuxDelete(dmux);
    return NULL;
  }
  return dmux;
}